

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_PlaySpawnSound(AActor *missile,AActor *spawner)

{
  AActor *ent;
  AActor *ent_00;
  int iVar1;
  uint uVar2;
  FSoundID local_44;
  DVector3 local_40;
  FSoundID local_24;
  FSoundID local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *spawner_local;
  AActor *missile_local;
  
  local_18 = spawner;
  spawner_local = missile;
  iVar1 = FSoundID::operator_cast_to_int(&(missile->SeeSound).super_FSoundID);
  if (iVar1 != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_1c,
               (int)spawner_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
    ent_00 = spawner_local;
    ent = local_18;
    if (uVar2 == 0) {
      FSoundID::FSoundID(&local_20,&(spawner_local->SeeSound).super_FSoundID);
      S_Sound(ent_00,2,&local_20,1.0,1.0);
    }
    else if (local_18 == (AActor *)0x0) {
      if ((spawner_local->Sector->Flags & 1) == 0) {
        AActor::Pos(&local_40,spawner_local);
        FSoundID::FSoundID(&local_44,&(spawner_local->SeeSound).super_FSoundID);
        S_Sound(&local_40,1,&local_44,1.0,1.0);
      }
    }
    else {
      FSoundID::FSoundID(&local_24,&(spawner_local->SeeSound).super_FSoundID);
      S_Sound(ent,1,&local_24,1.0,1.0);
    }
  }
  return;
}

Assistant:

void P_PlaySpawnSound(AActor *missile, AActor *spawner)
{
	if (missile->SeeSound != 0)
	{
		if (!(missile->flags & MF_SPAWNSOUNDSOURCE))
		{
			S_Sound (missile, CHAN_VOICE, missile->SeeSound, 1, ATTN_NORM);
		}
		else if (spawner != NULL)
		{
			S_Sound (spawner, CHAN_WEAPON, missile->SeeSound, 1, ATTN_NORM);
		}
		else
		{
			// If there is no spawner use the spawn position.
			// But not in a silenced sector.
			if (!(missile->Sector->Flags & SECF_SILENT))
				S_Sound (missile->Pos(), CHAN_WEAPON, missile->SeeSound, 1, ATTN_NORM);
		}
	}
}